

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_index(jit_State *J,RecordFFData *rd)

{
  ushort uVar1;
  TRef TVar2;
  TRef TVar3;
  CTypeID CVar4;
  RecordFFData *rd_00;
  CTState *cts_00;
  long *in_RSI;
  jit_State *in_RDI;
  CType *cct;
  CType *fct;
  CTSize fofs;
  GCstr *name;
  IRType t_1;
  CType *ctk;
  GCcdata *cdk;
  CTSize sz;
  IRType t;
  CTypeID sid;
  CType *ct;
  CTState *cts;
  GCcdata *cd;
  ptrdiff_t ofs;
  TRef ptr;
  TRef idx;
  CType *ct_3;
  CType *ct_2;
  CType *ct_1;
  TValue tv;
  jit_State *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined2 in_stack_fffffffffffffbc4;
  undefined2 in_stack_fffffffffffffbc6;
  jit_State *in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined2 in_stack_fffffffffffffbd4;
  IRRef1 in_stack_fffffffffffffbd6;
  IRRef1 IVar5;
  GCobj *in_stack_fffffffffffffbd8;
  undefined6 in_stack_fffffffffffffbe0;
  undefined2 in_stack_fffffffffffffbe6;
  IRRef1 IVar6;
  jit_State *in_stack_fffffffffffffbe8;
  undefined6 in_stack_fffffffffffffbf0;
  IRRef1 in_stack_fffffffffffffbf6;
  CType *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  uint in_stack_fffffffffffffc44;
  jit_State *in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc50;
  IRType in_stack_fffffffffffffc54;
  CType *in_stack_fffffffffffffc58;
  CType *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  CTSize in_stack_fffffffffffffc6c;
  uint local_38c;
  CType *local_388;
  CTState *pCVar7;
  jit_State *pjVar8;
  TRef local_368;
  TRef local_364;
  CType *local_350;
  CType *local_338;
  CType *local_320;
  CType *local_308;
  CType *local_2f8;
  
  local_368 = *in_RDI->base;
  pjVar8 = (jit_State *)0x8;
  rd_00 = (RecordFFData *)
          argv2cdata((jit_State *)CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                     (TRef)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                     (cTValue *)
                     CONCAT26(in_stack_fffffffffffffbd6,
                              CONCAT24(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0)));
  cts_00 = (CTState *)(ulong)in_RDI[-1].bpropcache[0xc].mode;
  for (local_320 = cts_00->tab + *(uint16_t *)((long)((GCRef *)&rd_00->argv + 1) + 2);
      local_320->info >> 0x1c == 8; local_320 = cts_00->tab + (local_320->info & 0xffff)) {
  }
  local_388 = local_320;
  local_38c = 0;
  local_338 = in_stack_fffffffffffffc58;
  if (local_320->info >> 0x1c == 2) {
    uVar1 = 5;
    if (local_320->size == 8) {
      uVar1 = 9;
    }
    if ((local_320->info & 0xf0800000) == 0x20800000) {
      local_2f8 = local_320;
      do {
        local_388 = cts_00->tab + (local_2f8->info & 0xffff);
        local_2f8 = local_388;
      } while (local_388->info >> 0x1c == 8);
    }
    (in_RDI->fold).ins.field_0.ot = uVar1 | 0x4400;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_368;
    (in_RDI->fold).ins.field_0.op2 = 0xf;
    TVar2 = lj_opt_fold(in_stack_fffffffffffffbc8);
    pjVar8 = (jit_State *)0x0;
    local_368 = crec_reassoc_ofs(in_RDI,TVar2,(ptrdiff_t *)&stack0xfffffffffffffc90,1);
    local_338 = in_stack_fffffffffffffc58;
  }
  do {
    local_364 = in_RDI->base[1];
    IVar6 = (IRRef1)local_368;
    if ((local_364 >> 0x18 & 0x1f) - 0xe < 6) {
      local_364 = lj_opt_narrow_cindex(in_stack_fffffffffffffbb8,0);
      if (local_388->info >> 0x1d == 1) {
LAB_001b41f6:
        if ((local_388->info & 0x4000000) != 0) {
          TVar2 = lj_ir_kint64((jit_State *)
                               CONCAT26(in_stack_fffffffffffffbc6,
                                        CONCAT24(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0
                                                )),(uint64_t)in_stack_fffffffffffffbb8);
          (in_RDI->fold).ins.field_0.ot = 0x2115;
          (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_364;
          (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
          local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
        }
        local_38c = local_388->info & 0xffff;
        in_stack_fffffffffffffc6c = lj_ctype_size(cts_00,local_38c);
        TVar2 = crec_reassoc_ofs(in_RDI,local_364,(ptrdiff_t *)&stack0xfffffffffffffc90,
                                 in_stack_fffffffffffffc6c);
        TVar3 = lj_ir_kint64((jit_State *)
                             CONCAT26(in_stack_fffffffffffffbc6,
                                      CONCAT24(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0))
                             ,(uint64_t)in_stack_fffffffffffffbb8);
        (in_RDI->fold).ins.field_0.ot = 0x2b15;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar3;
        local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
        (in_RDI->fold).ins.field_0.ot = 0x2909;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_364;
        (in_RDI->fold).ins.field_0.op2 = IVar6;
        local_368 = lj_opt_fold(in_stack_fffffffffffffbc8);
      }
    }
    else {
      IVar5 = (IRRef1)local_364;
      if ((local_364 & 0x1f000000) == 0xa000000) {
        in_stack_fffffffffffffc60 = (CType *)(ulong)*(uint *)(*in_RSI + 8);
        for (local_338 = cts_00->tab + *(ushort *)((long)&in_stack_fffffffffffffc60->size + 2);
            local_338->info >> 0x1c == 8; local_338 = cts_00->tab + (local_338->info & 0xffff)) {
        }
        in_stack_fffffffffffffc54 = crec_ct2irt(cts_00,local_338);
        if (((local_388->info >> 0x1d == 1) && (IRT_NUM < in_stack_fffffffffffffc54)) &&
           (in_stack_fffffffffffffc54 < IRT_SOFTFP)) {
          if (local_338->size == 8) {
            (in_RDI->fold).ins.field_0.ot = (ushort)in_stack_fffffffffffffc54 | 0x4400;
            (in_RDI->fold).ins.field_0.op1 = IVar5;
            (in_RDI->fold).ins.field_0.op2 = 0x11;
            local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
          }
          else if (local_338->size == 4) {
            (in_RDI->fold).ins.field_0.ot = (ushort)in_stack_fffffffffffffc54 | 0x4400;
            (in_RDI->fold).ins.field_0.op1 = IVar5;
            (in_RDI->fold).ins.field_0.op2 = 0x10;
            local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
          }
          else {
            TVar2 = lj_ir_kint64((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffbc6,
                                          CONCAT24(in_stack_fffffffffffffbc4,
                                                   in_stack_fffffffffffffbc0)),
                                 (uint64_t)in_stack_fffffffffffffbb8);
            (in_RDI->fold).ins.field_0.ot = 0x2909;
            (in_RDI->fold).ins.field_0.op1 = IVar5;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
            TVar2 = lj_opt_fold(in_stack_fffffffffffffbc8);
            (in_RDI->fold).ins.field_0.ot = (ushort)in_stack_fffffffffffffc54 | 0x4500;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
            (in_RDI->fold).ins.field_0.op2 = 0;
            local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
          }
          if ((local_338->size < 8) && ((local_338->info & 0x800000) == 0)) {
            (in_RDI->fold).ins.field_0.ot = 0x5915;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_364;
            (in_RDI->fold).ins.field_0.op2 = 0xab3;
            local_364 = lj_opt_fold(in_stack_fffffffffffffbc8);
          }
          goto LAB_001b41f6;
        }
      }
      else if ((local_364 & 0x1f000000) == 0x4000000) {
        in_stack_fffffffffffffc48 = (jit_State *)(ulong)*(uint *)(*in_RSI + 8);
        pCVar7 = cts_00;
        if ((rd_00 != (RecordFFData *)0x0) &&
           (*(uint16_t *)((long)((GCRef *)&rd_00->argv + 1) + 2) == 0x15)) {
          CVar4 = crec_constructor((jit_State *)
                                   CONCAT26(in_stack_fffffffffffffbd6,
                                            CONCAT24(in_stack_fffffffffffffbd4,
                                                     in_stack_fffffffffffffbd0)),
                                   (GCcdata *)in_stack_fffffffffffffbc8,
                                   CONCAT22(in_stack_fffffffffffffbc6,in_stack_fffffffffffffbc4));
          for (local_350 = cts_00->tab + CVar4; local_350->info >> 0x1c == 8;
              local_350 = cts_00->tab + (local_350->info & 0xffff)) {
          }
          local_388 = local_350;
        }
        if (local_388->info >> 0x1c == 1) {
          in_stack_fffffffffffffc38 =
               lj_ctype_getfieldq((CTState *)in_stack_fffffffffffffbe8,
                                  (CType *)CONCAT26(in_stack_fffffffffffffbe6,
                                                    in_stack_fffffffffffffbe0),
                                  &in_stack_fffffffffffffbd8->str,
                                  (CTSize *)
                                  CONCAT26(in_stack_fffffffffffffbd6,
                                           CONCAT24(in_stack_fffffffffffffbd4,
                                                    in_stack_fffffffffffffbd0)),
                                  (CTInfo *)in_stack_fffffffffffffbc8);
          cts_00 = pCVar7;
          if (in_stack_fffffffffffffc38 != (CType *)0x0) {
            pjVar8 = (jit_State *)
                     ((long)&(pjVar8->cur).nextgc.gcptr32 + (ulong)in_stack_fffffffffffffc44);
            in_stack_fffffffffffffbe8 = in_RDI;
            TVar2 = lj_ir_kgc((jit_State *)
                              CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8,
                              CONCAT22(in_stack_fffffffffffffbd6,in_stack_fffffffffffffbd4));
            (in_stack_fffffffffffffbe8->fold).ins.field_0.ot = 0x884;
            (in_stack_fffffffffffffbe8->fold).ins.field_0.op1 = IVar5;
            (in_stack_fffffffffffffbe8->fold).ins.field_0.op2 = (IRRef1)TVar2;
            lj_opt_fold(in_stack_fffffffffffffbc8);
            if (in_stack_fffffffffffffc38->info >> 0x1c == 0xb) {
              if ((0x7fffffff < in_stack_fffffffffffffc38->size) &&
                 ((pCVar7->tab[in_stack_fffffffffffffc38->info & 0xffff].info & 0x800000) != 0)) {
                TVar2 = lj_ir_knum_u64((jit_State *)
                                       CONCAT26(in_stack_fffffffffffffbc6,
                                                CONCAT24(in_stack_fffffffffffffbc4,
                                                         in_stack_fffffffffffffbc0)),
                                       (uint64_t)in_stack_fffffffffffffbb8);
                *in_RDI->base = TVar2;
                return;
              }
              TVar2 = lj_ir_kint((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffbd6,
                                          CONCAT24(in_stack_fffffffffffffbd4,
                                                   in_stack_fffffffffffffbd0)),
                                 (int32_t)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
              *in_RDI->base = TVar2;
              return;
            }
            if (in_stack_fffffffffffffc38->info >> 0x1c == 10) {
              if (pjVar8 != (jit_State *)0x0) {
                TVar2 = lj_ir_kint64((jit_State *)
                                     CONCAT26(in_stack_fffffffffffffbc6,
                                              CONCAT24(in_stack_fffffffffffffbc4,
                                                       in_stack_fffffffffffffbc0)),
                                     (uint64_t)in_stack_fffffffffffffbb8);
                (in_RDI->fold).ins.field_0.ot = 0x2909;
                (in_RDI->fold).ins.field_0.op1 = IVar6;
                (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
                lj_opt_fold(in_stack_fffffffffffffbc8);
              }
              crec_index_bf(pjVar8,rd_00,(TRef)((ulong)pCVar7 >> 0x20),(CTInfo)pCVar7);
              return;
            }
            local_38c = in_stack_fffffffffffffc38->info & 0xffff;
            in_stack_fffffffffffffbf6 = IVar5;
            cts_00 = pCVar7;
          }
        }
        else {
          cts_00 = pCVar7;
          if ((((local_388->info & 0xf4000000) == 0x34000000) &&
              ((in_stack_fffffffffffffc48->cur).gclist.gcptr32 == 2)) &&
             (((*(char *)&(in_stack_fffffffffffffc48->cur).ir == 'r' &&
               (*(char *)((long)&(in_stack_fffffffffffffc48->cur).ir + 1) == 'e')) ||
              ((*(char *)&(in_stack_fffffffffffffc48->cur).ir == 'i' &&
               (*(char *)((long)&(in_stack_fffffffffffffc48->cur).ir + 1) == 'm')))))) {
            in_stack_fffffffffffffbc8 = in_RDI;
            TVar2 = lj_ir_kgc((jit_State *)
                              CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8,CONCAT22(IVar5,in_stack_fffffffffffffbd4));
            (in_stack_fffffffffffffbc8->fold).ins.field_0.ot = 0x884;
            (in_stack_fffffffffffffbc8->fold).ins.field_0.op1 = IVar5;
            (in_stack_fffffffffffffbc8->fold).ins.field_0.op2 = (IRRef1)TVar2;
            lj_opt_fold(in_stack_fffffffffffffbc8);
            if (*(char *)&(in_stack_fffffffffffffc48->cur).ir == 'i') {
              pjVar8 = (jit_State *)
                       ((long)&(pjVar8->cur).nextgc.gcptr32 + (ulong)(local_388->size >> 1));
            }
            local_38c = local_388->info & 0xffff;
            in_stack_fffffffffffffbd6 = IVar5;
            cts_00 = pCVar7;
          }
        }
      }
    }
    if (local_38c != 0) {
      if (pjVar8 != (jit_State *)0x0) {
        pjVar8 = in_RDI;
        TVar2 = lj_ir_kint64((jit_State *)
                             CONCAT26((IRRef1)local_368,
                                      CONCAT24(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0))
                             ,(uint64_t)in_RDI);
        (pjVar8->fold).ins.field_0.ot = 0x2909;
        (pjVar8->fold).ins.field_0.op1 = (IRRef1)local_368;
        (pjVar8->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar2 = lj_opt_fold(in_stack_fffffffffffffbc8);
        local_368._0_2_ = (IRRef1)TVar2;
      }
      local_388 = cts_00->tab + local_38c;
      if ((local_388->info & 0xf0800000) == 0x20800000) {
        (in_RDI->fold).ins.field_0.ot = 0x4509;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_368;
        (in_RDI->fold).ins.field_0.op2 = 0;
        lj_opt_fold(in_stack_fffffffffffffbc8);
        local_388 = cts_00->tab + (local_388->info & 0xffff);
      }
      for (; local_388->info >> 0x1c == 8; local_388 = cts_00->tab + (local_388->info & 0xffff)) {
      }
      if ((int)in_RSI[2] == 0) {
        TVar2 = crec_tv_ct(in_stack_fffffffffffffc48,
                           (CType *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                           (CTypeID)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                           (TRef)in_stack_fffffffffffffc38);
        *in_RDI->base = TVar2;
        return;
      }
      in_RSI[1] = 0;
      in_RDI->needsnap = '\x01';
      crec_ct_tv((jit_State *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                 in_stack_fffffffffffffc60,(TRef)((ulong)local_338 >> 0x20),(TRef)local_338,
                 (cTValue *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
      return;
    }
    if (local_388->info >> 0x1c != 2) {
LAB_001b514c:
      crec_index_meta((jit_State *)CONCAT26(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0),
                      (CTState *)in_stack_fffffffffffffbe8,
                      (CType *)CONCAT26(in_stack_fffffffffffffbe6,in_stack_fffffffffffffbe0),
                      (RecordFFData *)&in_stack_fffffffffffffbd8->gch);
      return;
    }
    local_308 = local_388;
    do {
      local_388 = cts_00->tab + (local_308->info & 0xffff);
      local_308 = local_388;
    } while (local_388->info >> 0x1c == 8);
    if ((local_388->info >> 0x1c != 1) ||
       (rd_00 = (RecordFFData *)0x0, (local_364 & 0x1f000000) != 0x4000000)) goto LAB_001b514c;
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_index(jit_State *J, RecordFFData *rd)
{
  TRef idx, ptr = J->base[0];
  ptrdiff_t ofs = sizeof(GCcdata);
  GCcdata *cd = argv2cdata(J, ptr, &rd->argv[0]);
  CTState *cts = ctype_ctsG(J2G(J));
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTypeID sid = 0;

  /* Resolve pointer or reference for cdata object. */
  if (ctype_isptr(ct->info)) {
    IRType t = (LJ_64 && ct->size == 8) ? IRT_P64 : IRT_P32;
    if (ctype_isref(ct->info)) ct = ctype_rawchild(cts, ct);
    ptr = emitir(IRT(IR_FLOAD, t), ptr, IRFL_CDATA_PTR);
    ofs = 0;
    ptr = crec_reassoc_ofs(J, ptr, &ofs, 1);
  }

again:
  idx = J->base[1];
  if (tref_isnumber(idx)) {
    idx = lj_opt_narrow_cindex(J, idx);
    if (ctype_ispointer(ct->info)) {
      CTSize sz;
  integer_key:
      if ((ct->info & CTF_COMPLEX))
	idx = emitir(IRT(IR_BAND, IRT_INTP), idx, lj_ir_kintp(J, 1));
      sz = lj_ctype_size(cts, (sid = ctype_cid(ct->info)));
      idx = crec_reassoc_ofs(J, idx, &ofs, sz);
#if LJ_TARGET_ARM || LJ_TARGET_PPC
      /* Hoist base add to allow fusion of index/shift into operands. */
      if (LJ_LIKELY(J->flags & JIT_F_OPT_LOOP) && ofs
#if LJ_TARGET_ARM
	  && (sz == 1 || sz == 4)
#endif
	  ) {
	ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	ofs = 0;
      }
#endif
      idx = emitir(IRT(IR_MUL, IRT_INTP), idx, lj_ir_kintp(J, sz));
      ptr = emitir(IRT(IR_ADD, IRT_PTR), idx, ptr);
    }
  } else if (tref_iscdata(idx)) {
    GCcdata *cdk = cdataV(&rd->argv[1]);
    CType *ctk = ctype_raw(cts, cdk->ctypeid);
    IRType t = crec_ct2irt(cts, ctk);
    if (ctype_ispointer(ct->info) && t >= IRT_I8 && t <= IRT_U64) {
      if (ctk->size == 8) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT64);
      } else if (ctk->size == 4) {
	idx = emitir(IRT(IR_FLOAD, t), idx, IRFL_CDATA_INT);
      } else {
	idx = emitir(IRT(IR_ADD, IRT_PTR), idx,
		     lj_ir_kintp(J, sizeof(GCcdata)));
	idx = emitir(IRT(IR_XLOAD, t), idx, 0);
      }
      if (LJ_64 && ctk->size < sizeof(intptr_t) && !(ctk->info & CTF_UNSIGNED))
	idx = emitconv(idx, IRT_INTP, IRT_INT, IRCONV_SEXT);
      if (!LJ_64 && ctk->size > sizeof(intptr_t)) {
	idx = emitconv(idx, IRT_INTP, t, 0);
	lj_needsplit(J);
      }
      goto integer_key;
    }
  } else if (tref_isstr(idx)) {
    GCstr *name = strV(&rd->argv[1]);
    if (cd && cd->ctypeid == CTID_CTYPEID)
      ct = ctype_raw(cts, crec_constructor(J, cd, ptr));
    if (ctype_isstruct(ct->info)) {
      CTSize fofs;
      CType *fct;
      fct = lj_ctype_getfield(cts, ct, name, &fofs);
      if (fct) {
	ofs += (ptrdiff_t)fofs;
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (ctype_isconstval(fct->info)) {
	  if (fct->size >= 0x80000000u &&
	      (ctype_child(cts, fct)->info & CTF_UNSIGNED)) {
	    J->base[0] = lj_ir_knum(J, (lua_Number)(uint32_t)fct->size);
	    return;
	  }
	  J->base[0] = lj_ir_kint(J, (int32_t)fct->size);
	  return;  /* Interpreter will throw for newindex. */
	} else if (ctype_isbitfield(fct->info)) {
	  if (ofs)
	    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));
	  crec_index_bf(J, rd, ptr, fct->info);
	  return;
	} else {
	  lj_assertJ(ctype_isfield(fct->info), "field expected");
	  sid = ctype_cid(fct->info);
	}
      }
    } else if (ctype_iscomplex(ct->info)) {
      if (name->len == 2 &&
	  ((strdata(name)[0] == 'r' && strdata(name)[1] == 'e') ||
	   (strdata(name)[0] == 'i' && strdata(name)[1] == 'm'))) {
	/* Always specialize to the field name. */
	emitir(IRTG(IR_EQ, IRT_STR), idx, lj_ir_kstr(J, name));
	if (strdata(name)[0] == 'i') ofs += (ct->size >> 1);
	sid = ctype_cid(ct->info);
      }
    }
  }
  if (!sid) {
    if (ctype_isptr(ct->info)) {  /* Automatically perform '->'. */
      CType *cct = ctype_rawchild(cts, ct);
      if (ctype_isstruct(cct->info)) {
	ct = cct;
	cd = NULL;
	if (tref_isstr(idx)) goto again;
      }
    }
    crec_index_meta(J, cts, ct, rd);
    return;
  }

  if (ofs)
    ptr = emitir(IRT(IR_ADD, IRT_PTR), ptr, lj_ir_kintp(J, ofs));

  /* Resolve reference for field. */
  ct = ctype_get(cts, sid);
  if (ctype_isref(ct->info)) {
    ptr = emitir(IRT(IR_XLOAD, IRT_PTR), ptr, 0);
    sid = ctype_cid(ct->info);
    ct = ctype_get(cts, sid);
  }

  while (ctype_isattrib(ct->info))
    ct = ctype_child(cts, ct);  /* Skip attributes. */

  if (rd->data == 0) {  /* __index metamethod. */
    J->base[0] = crec_tv_ct(J, ct, sid, ptr);
  } else {  /* __newindex metamethod. */
    rd->nres = 0;
    J->needsnap = 1;
    crec_ct_tv(J, ct, ptr, J->base[2], &rd->argv[2]);
  }
}